

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

RPCHelpMan * wallet::unloadwallet(void)

{
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  string description_03;
  string description_04;
  RPCMethodImpl fun;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar1 [32];
  long lVar2;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  undefined4 in_stack_fffffffffffff758;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffff75c;
  undefined8 in_stack_fffffffffffff760;
  undefined8 in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff770;
  _Manager_type in_stack_fffffffffffff778;
  undefined8 in_stack_fffffffffffff780;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff788;
  pointer in_stack_fffffffffffff798;
  pointer pRVar4;
  pointer in_stack_fffffffffffff7a0;
  pointer pRVar5;
  pointer in_stack_fffffffffffff7a8;
  pointer pRVar6;
  _Vector_impl_data in_stack_fffffffffffff7b0;
  undefined1 in_stack_fffffffffffff7c8 [16];
  pointer in_stack_fffffffffffff7d8;
  pointer in_stack_fffffffffffff7e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff7e8;
  undefined1 in_stack_fffffffffffff7f8 [16];
  undefined1 in_stack_fffffffffffff808 [56];
  string local_7a8;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_708;
  char *local_6e8;
  size_type local_6e0;
  char local_6d8 [8];
  undefined8 uStack_6d0;
  string local_6c8 [32];
  string local_6a8 [32];
  RPCResult local_688;
  string local_600 [32];
  string local_5e0 [32];
  RPCResult local_5c0;
  string local_538 [32];
  string local_518 [32];
  RPCResult local_4f8;
  RPCArgOptions local_470;
  string local_428 [32];
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_408;
  undefined1 local_3b0;
  string local_3a8 [32];
  RPCArgOptions local_388;
  string local_340 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_300;
  string local_2a0 [32];
  RPCArg local_280 [2];
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"unloadwallet",(allocator<char> *)&stack0xfffffffffffff837);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "Unloads the wallet referenced by the request endpoint, otherwise unloads the wallet specified in the argument.\nSpecifying the wallet name on a wallet endpoint is invalid."
             ,(allocator<char> *)&stack0xfffffffffffff836);
  std::__cxx11::string::string<std::allocator<char>>
            (local_2a0,"wallet_name",(allocator<char> *)&stack0xfffffffffffff817);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_320,"the wallet name from the RPC endpoint",
             (allocator<char> *)&stack0xfffffffffffff816);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,std::__cxx11::string,UniValue> *)&local_300,&local_320);
  std::__cxx11::string::string<std::allocator<char>>
            (local_340,
             "The name of the wallet to unload. If provided both here and in the RPC endpoint, the two must be identical."
             ,(allocator<char> *)&stack0xfffffffffffff815);
  local_388.oneline_description._M_dataplus._M_p = (pointer)&local_388.oneline_description.field_2;
  local_388.skip_type_check = false;
  local_388.oneline_description._M_string_length = 0;
  local_388.oneline_description.field_2._M_local_buf[0] = '\0';
  local_388.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_388.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_388.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_388._58_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff75c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff758;
  name._M_string_length = in_stack_fffffffffffff760;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff768;
  name.field_2._8_8_ = in_stack_fffffffffffff770;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff780;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff778;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff788;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff798;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff7a0;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff7a8;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff7b0._M_start;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7b0._M_finish;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff7b0._M_end_of_storage;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff7c8;
  description_03._M_string_length = (size_type)in_stack_fffffffffffff7e0;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7d8;
  description_03.field_2 = in_stack_fffffffffffff7e8;
  opts.oneline_description._M_string_length = in_stack_fffffffffffff808._0_8_;
  opts.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff808._8_16_;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff808._24_24_;
  opts.hidden = (bool)in_stack_fffffffffffff808[0x30];
  opts.also_positional = (bool)in_stack_fffffffffffff808[0x31];
  opts._66_6_ = in_stack_fffffffffffff808._50_6_;
  opts.skip_type_check = (bool)in_stack_fffffffffffff7f8[0];
  opts._1_7_ = in_stack_fffffffffffff7f8._1_7_;
  opts.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7f8._8_8_;
  RPCArg::RPCArg(local_280,name,(Type)local_2a0,fallback,description_03,opts);
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a8,"load_on_startup",(allocator<char> *)&stack0xfffffffffffff814);
  local_408._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)OMITTED;
  local_3b0 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_428,
             "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."
             ,(allocator<char> *)&stack0xfffffffffffff813);
  local_470.oneline_description._M_dataplus._M_p = (pointer)&local_470.oneline_description.field_2;
  local_470.skip_type_check = false;
  local_470.oneline_description._M_string_length = 0;
  local_470.oneline_description.field_2._M_local_buf[0] = '\0';
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
  local_470.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
  local_470._58_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff75c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff758;
  name_00._M_string_length = in_stack_fffffffffffff760;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff768;
  name_00.field_2._8_8_ = in_stack_fffffffffffff770;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff780;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff778;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff788;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff798;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff7a0;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff7a8;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff7b0._M_start;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff7b0._M_finish;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff7b0._M_end_of_storage;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._80_16_
       = in_stack_fffffffffffff7c8;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff7e0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7d8;
  description_04.field_2 = in_stack_fffffffffffff7e8;
  opts_00.oneline_description._M_string_length = in_stack_fffffffffffff808._0_8_;
  opts_00.oneline_description.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff808._8_16_;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data =
       (_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )in_stack_fffffffffffff808._24_24_;
  opts_00.hidden = (bool)in_stack_fffffffffffff808[0x30];
  opts_00.also_positional = (bool)in_stack_fffffffffffff808[0x31];
  opts_00._66_6_ = in_stack_fffffffffffff808._50_6_;
  opts_00.skip_type_check = (bool)in_stack_fffffffffffff7f8[0];
  opts_00._1_7_ = in_stack_fffffffffffff7f8._1_7_;
  opts_00.oneline_description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7f8._8_8_;
  RPCArg::RPCArg(local_280 + 1,name_00,(Type)local_3a8,fallback_00,description_04,opts_00);
  __l._M_len = 2;
  __l._M_array = local_280;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff818,__l,
             (allocator_type *)&stack0xfffffffffffff812);
  std::__cxx11::string::string<std::allocator<char>>
            (local_518,"",(allocator<char> *)&stack0xfffffffffffff7f7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_538,"",(allocator<char> *)&stack0xfffffffffffff7f6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_5e0,"warnings",(allocator<char> *)&stack0xfffffffffffff7d7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_600,"Warning messages, if any, related to unloading the wallet.",
             (allocator<char> *)&stack0xfffffffffffff7d6);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6a8,"",(allocator<char> *)&stack0xfffffffffffff7b7);
  std::__cxx11::string::string<std::allocator<char>>
            (local_6c8,"",(allocator<char> *)&stack0xfffffffffffff7b6);
  pRVar4 = (pointer)0x0;
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff75c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff758;
  m_key_name._M_string_length = in_stack_fffffffffffff760;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff768;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff770;
  description._M_string_length = in_stack_fffffffffffff780;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  description.field_2 = in_stack_fffffffffffff788;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_688,STR,m_key_name,description,inner,SUB81(local_6a8,0));
  __l_00._M_len = 1;
  __l_00._M_array = &local_688;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7b8,__l_00,
             (allocator_type *)&stack0xfffffffffffff797);
  uVar3 = 0;
  auVar1._4_8_ = in_stack_fffffffffffff760;
  auVar1._0_4_ = in_stack_fffffffffffff75c;
  auVar1._12_8_ = in_stack_fffffffffffff768;
  auVar1._20_8_ = in_stack_fffffffffffff770;
  auVar1._28_4_ = 0;
  description_00._M_string_length = in_stack_fffffffffffff780;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  description_00.field_2._M_local_buf = in_stack_fffffffffffff788._M_local_buf;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult
            (&local_5c0,ARR,(string)(auVar1 << 0x20),SUB81(local_5e0,0),description_00,inner_00,true
            );
  __l_01._M_len = 1;
  __l_01._M_array = &local_5c0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8,__l_01,
             (allocator_type *)&stack0xfffffffffffff796);
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff75c;
  m_key_name_00._M_dataplus._M_p._0_4_ = uVar3;
  m_key_name_00._M_string_length = in_stack_fffffffffffff760;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff768;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff770;
  description_01._M_string_length = in_stack_fffffffffffff780;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff778;
  description_01.field_2 = in_stack_fffffffffffff788;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar5;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar4;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar6;
  RPCResult::RPCResult(&local_4f8,OBJ,m_key_name_00,description_01,inner_01,SUB81(local_518,0));
  result._4_4_ = in_stack_fffffffffffff75c;
  result.m_type = uVar3;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff760;
  result.m_key_name._M_string_length = in_stack_fffffffffffff768;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff770;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff778;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff780;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff788;
  result._64_8_ = pRVar4;
  result.m_description._M_dataplus._M_p = (pointer)pRVar5;
  result.m_description._M_string_length = (size_type)pRVar6;
  result._88_24_ = in_stack_fffffffffffff7b0;
  result.m_cond._8_16_ = in_stack_fffffffffffff7c8;
  result.m_cond.field_2._8_8_ = in_stack_fffffffffffff7d8;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff7f8,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_748,"unloadwallet",(allocator<char> *)&stack0xfffffffffffff795);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"wallet_name",(allocator<char> *)&stack0xfffffffffffff794);
  HelpExampleCli(&local_728,&local_748,&local_768);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7a8,"unloadwallet",(allocator<char> *)&stack0xfffffffffffff793);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff838,"wallet_name",
             (allocator<char> *)&stack0xfffffffffffff792);
  HelpExampleRpc(&local_788,&local_7a8,(string *)&stack0xfffffffffffff838);
  std::operator+(&local_708,&local_728,&local_788);
  local_6e8 = local_6d8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p == &local_708.field_2) {
    uStack_6d0 = local_708.field_2._8_8_;
  }
  else {
    local_6e8 = local_708._M_dataplus._M_p;
  }
  local_6e0 = local_708._M_string_length;
  local_708._M_string_length = 0;
  local_708.field_2._M_local_buf[0] = '\0';
  description_02._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:465:9)>
       ::_M_invoke;
  description_02._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:465:9)>
                ::_M_manager;
  description_02.field_2 = in_stack_fffffffffffff788;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar5;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar4;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar6;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff7d8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_fffffffffffff7c8._0_8_;
  examples.m_examples._M_string_length = in_stack_fffffffffffff7c8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_fffffffffffff7e0;
  fun.super__Function_base._M_manager = (_Manager_type)in_stack_fffffffffffff7f8._0_8_;
  fun._M_invoker = (_Invoker_type)in_stack_fffffffffffff7f8._8_8_;
  fun.super__Function_base._M_functor._M_pod_data = in_stack_fffffffffffff7e8._M_local_buf;
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff760,&stack0xfffffffffffff768)),
             description_02,args,(RPCResults)in_stack_fffffffffffff7b0,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff768);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_708);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff838);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::__cxx11::string::~string((string *)&local_728);
  std::__cxx11::string::~string((string *)&local_768);
  std::__cxx11::string::~string((string *)&local_748);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7f8);
  RPCResult::~RPCResult(&local_4f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7d8);
  RPCResult::~RPCResult(&local_5c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff7b8);
  RPCResult::~RPCResult(&local_688);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff798);
  std::__cxx11::string::~string(local_6c8);
  std::__cxx11::string::~string(local_6a8);
  std::__cxx11::string::~string(local_600);
  std::__cxx11::string::~string(local_5e0);
  std::__cxx11::string::~string(local_538);
  std::__cxx11::string::~string(local_518);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff818);
  lVar2 = 0x108;
  do {
    RPCArg::~RPCArg((RPCArg *)((long)&local_280[0].m_names._M_dataplus._M_p + lVar2));
    lVar2 = lVar2 + -0x108;
  } while (lVar2 != -0x108);
  RPCArgOptions::~RPCArgOptions(&local_470);
  std::__cxx11::string::~string(local_428);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_408._M_first);
  std::__cxx11::string::~string(local_3a8);
  RPCArgOptions::~RPCArgOptions(&local_388);
  std::__cxx11::string::~string(local_340);
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage(&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan unloadwallet()
{
    return RPCHelpMan{"unloadwallet",
                "Unloads the wallet referenced by the request endpoint, otherwise unloads the wallet specified in the argument.\n"
                "Specifying the wallet name on a wallet endpoint is invalid.",
                {
                    {"wallet_name", RPCArg::Type::STR, RPCArg::DefaultHint{"the wallet name from the RPC endpoint"}, "The name of the wallet to unload. If provided both here and in the RPC endpoint, the two must be identical."},
                    {"load_on_startup", RPCArg::Type::BOOL, RPCArg::Optional::OMITTED, "Save wallet name to persistent settings and load on startup. True to add wallet to startup list, false to remove, null to leave unchanged."},
                },
                RPCResult{RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::ARR, "warnings", /*optional=*/true, "Warning messages, if any, related to unloading the wallet.",
                    {
                        {RPCResult::Type::STR, "", ""},
                    }},
                }},
                RPCExamples{
                    HelpExampleCli("unloadwallet", "wallet_name")
            + HelpExampleRpc("unloadwallet", "wallet_name")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::string wallet_name;
    if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
        if (!(request.params[0].isNull() || request.params[0].get_str() == wallet_name)) {
            throw JSONRPCError(RPC_INVALID_PARAMETER, "RPC endpoint wallet and wallet_name parameter specify different wallets");
        }
    } else {
        wallet_name = request.params[0].get_str();
    }

    WalletContext& context = EnsureWalletContext(request.context);
    std::shared_ptr<CWallet> wallet = GetWallet(context, wallet_name);
    if (!wallet) {
        throw JSONRPCError(RPC_WALLET_NOT_FOUND, "Requested wallet does not exist or is not loaded");
    }

    std::vector<bilingual_str> warnings;
    {
        WalletRescanReserver reserver(*wallet);
        if (!reserver.reserve()) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Wallet is currently rescanning. Abort existing rescan or wait.");
        }

        // Release the "main" shared pointer and prevent further notifications.
        // Note that any attempt to load the same wallet would fail until the wallet
        // is destroyed (see CheckUniqueFileid).
        std::optional<bool> load_on_start{self.MaybeArg<bool>("load_on_startup")};
        if (!RemoveWallet(context, wallet, load_on_start, warnings)) {
            throw JSONRPCError(RPC_MISC_ERROR, "Requested wallet already unloaded");
        }
    }

    WaitForDeleteWallet(std::move(wallet));

    UniValue result(UniValue::VOBJ);
    PushWarnings(warnings, result);

    return result;
},
    };
}